

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCex.c
# Opt level: O2

Abc_Cex_t *
Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *p,Abc_Cex_t *pCex,int fHighEffort,int fVerbose)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  sat_solver *psVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *p_00;
  int *piVar8;
  abctime time;
  abctime time_00;
  abctime time_01;
  abctime time_02;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  size_t __size;
  Abc_Cex_t *local_80;
  Vec_Int_t *vLits;
  sat_solver *local_70;
  ulong local_68;
  abctime local_60;
  int local_58;
  int iLit;
  Abc_Cex_t *local_50;
  Vec_Int_t *vTemp;
  Cnf_Dat_t *local_40;
  Gia_Man_t *local_38;
  
  local_58 = fHighEffort;
  Abc_Clock();
  vLits = (Vec_Int_t *)0x0;
  aVar4 = Abc_Clock();
  local_80 = Bmc_CexCareMinimizeAig(p,p->vCis->nSize - p->nRegs,pCex,1,1,fVerbose);
  uVar9 = 0;
  for (uVar1 = local_80->nRegs; (int)uVar1 < local_80->nBits; uVar1 = uVar1 + 1) {
    uVar9 = uVar9 + (((uint)(&local_80[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0);
  }
  if (fVerbose != 0) {
    printf("Care bits = %d. ",(ulong)uVar9);
    aVar5 = Abc_Clock();
    Abc_PrintTime(0x84c069,(char *)(aVar5 - aVar4),time);
  }
  uVar11 = (ulong)uVar9;
  local_60 = Abc_Clock();
  local_38 = Gia_ManFramesForCexMin(p,pCex->iFrame + 1);
  local_40 = (Cnf_Dat_t *)Mf_ManGenerateCnf(local_38,8,0,0,0,0);
  local_68 = (ulong)(uint)(~pCex->iFrame * pCex->nPis + local_40->nVars);
  psVar6 = (sat_solver *)Cnf_DataWriteIntoSolver(local_40,1,0);
  iLit = 3;
  local_70 = psVar6;
  iVar2 = sat_solver_addclause(psVar6,&iLit,(lit *)&local_50);
  if (iVar2 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCex.c"
                  ,0x224,
                  "Abc_Cex_t *Bmc_CexCareSatBasedMinimizeAig(Gia_Man_t *, Abc_Cex_t *, int, int)");
  }
  pVVar7 = Vec_IntAlloc((int)psVar6);
  vTemp = pVVar7;
  for (uVar1 = pCex->nRegs; (int)uVar1 < pCex->nBits; uVar1 = uVar1 + 1) {
    iVar2 = Abc_Var2Lit(((int)local_68 + uVar1) - pCex->nRegs,
                        (uint)(((uint)(&pCex[1].iPo)[(int)uVar1 >> 5] >> (uVar1 & 0x1f) & 1) == 0));
    Vec_IntPush(pVVar7,iVar2);
  }
  local_50 = pCex;
  if (fVerbose != 0) {
    aVar4 = Abc_Clock();
    Abc_PrintTime(0x84c0d6,(char *)(aVar4 - local_60),time_00);
  }
  iVar2 = 2;
LAB_005b0afd:
  do {
    if (iVar2 == 0) {
      if (fVerbose != 0) {
        printf("Final    :    ");
        Bmc_CexPrint(local_80,local_80->nPis,0);
      }
      Vec_IntFreeP(&vLits);
      Vec_IntFreeP(&vTemp);
      sat_solver_delete(local_70);
      Cnf_DataFree(local_40);
      Gia_ManStop(local_38);
      return local_80;
    }
    local_60 = CONCAT44(local_60._4_4_,(int)uVar11);
    Vec_IntFreeP(&vLits);
    pVVar7 = vTemp;
    p_00 = (Vec_Int_t *)malloc(0x10);
    iVar3 = pVVar7->nSize;
    p_00->nSize = iVar3;
    p_00->nCap = iVar3;
    if ((long)iVar3 == 0) {
      __size = 0;
      piVar8 = (int *)0x0;
    }
    else {
      __size = (long)iVar3 << 2;
      piVar8 = (int *)malloc(__size);
    }
    p_00->pArray = piVar8;
    memcpy(piVar8,pVVar7->pArray,__size);
    vLits = p_00;
    if (iVar2 != 2) {
      Vec_IntReverseOrder(p_00);
    }
    aVar4 = Abc_Clock();
    psVar6 = local_70;
    iVar3 = sat_solver_solve(local_70,p_00->pArray,p_00->pArray + p_00->nSize,0,0,0,0);
    piVar8 = (psVar6->conf_final).ptr;
    uVar1 = (psVar6->conf_final).size;
    if (fVerbose != 0) {
      pcVar10 = "BUG";
      if (iVar3 == -1) {
        pcVar10 = "OK ";
      }
      printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar10,(ulong)uVar1);
      aVar5 = Abc_Clock();
      Abc_PrintTime(0x84bfe4,(char *)(aVar5 - aVar4),time_01);
    }
    uVar9 = (uint)local_60;
    if ((int)uVar1 < (int)(uint)local_60) {
      free(local_80);
      local_80 = Bmc_CexCareDeriveCex(local_50,(int)local_68,piVar8,uVar1);
      uVar9 = uVar1;
    }
    if (local_58 != 0) {
      aVar4 = Abc_Clock();
      uVar1 = sat_solver_minimize_assumptions(local_70,vLits->pArray,vLits->nSize,0);
      uVar11 = (ulong)uVar1;
      if (fVerbose != 0) {
        pcVar10 = "BUG";
        if (iVar3 == -1) {
          pcVar10 = "OK ";
        }
        printf("Status %s   Selected %5d assumptions out of %5d.  ",pcVar10,uVar11);
        aVar5 = Abc_Clock();
        Abc_PrintTime(0x84c125,(char *)(aVar5 - aVar4),time_02);
      }
      if ((int)uVar1 < (int)uVar9) {
        free(local_80);
        local_80 = Bmc_CexCareDeriveCex(local_50,(int)local_68,vLits->pArray,uVar1);
        iVar2 = iVar2 + -1;
        goto LAB_005b0afd;
      }
    }
    uVar11 = (ulong)uVar9;
    iVar2 = iVar2 + -1;
  } while( true );
}

Assistant:

Abc_Cex_t * Bmc_CexCareSatBasedMinimizeAig( Gia_Man_t * p, Abc_Cex_t * pCex, int fHighEffort, int fVerbose )
{
    abctime clk = Abc_Clock();
    int n, i, iFirstVar, iLit, status;
    Vec_Int_t * vLits = NULL, * vTemp;
    sat_solver * pSat;
    Cnf_Dat_t * pCnf;
    int nFinal, * pFinal;
    Abc_Cex_t * pCexBest = NULL; 
    int CountBest = 0;
    Gia_Man_t * pFrames;

    // CEX minimization
    clk = Abc_Clock();
    pCexBest = Bmc_CexCareMinimizeAig( p, Gia_ManPiNum(p), pCex, 1, 1, fVerbose );
    for ( i = pCexBest->nRegs; i < pCexBest->nBits; i++ )
        CountBest += Abc_InfoHasBit(pCexBest->pData, i);
    if ( fVerbose )
    {
        printf( "Care bits = %d. ", CountBest );
        Abc_PrintTime( 1, "Non-SAT-based CEX minimization", Abc_Clock() - clk );
    }

    // SAT instance
    clk = Abc_Clock();
    pFrames = Gia_ManFramesForCexMin( p, pCex->iFrame + 1 );
    pCnf = (Cnf_Dat_t*)Mf_ManGenerateCnf( pFrames, 8, 0, 0, 0, 0 );
    iFirstVar = pCnf->nVars - (pCex->iFrame+1) * pCex->nPis;
    pSat = (sat_solver*)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    iLit = Abc_Var2Lit( 1, 1 );
    status = sat_solver_addclause( pSat, &iLit, &iLit + 1 );
    assert( status );
    // create literals
    vTemp = Vec_IntAlloc( 100 );
    for ( i = pCex->nRegs; i < pCex->nBits; i++ )
        Vec_IntPush( vTemp, Abc_Var2Lit(iFirstVar + i - pCex->nRegs, !Abc_InfoHasBit(pCex->pData, i)) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Constructing SAT solver", Abc_Clock() - clk );

    for ( n = 0; n < 2; n++ )
    {
        Vec_IntFreeP( &vLits );

        vLits = Vec_IntDup( vTemp );
        if ( n ) Vec_IntReverseOrder( vLits );

        // SAT-based minimization
        clk = Abc_Clock();
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntLimit(vLits), 0, 0, 0, 0 );
        nFinal = sat_solver_final( pSat, &pFinal );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "Analyze_final", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, pFinal, nFinal );
        }
        if ( !fHighEffort )
            continue;

        // SAT-based minimization
        clk = Abc_Clock();
        nFinal = sat_solver_minimize_assumptions( pSat, Vec_IntArray(vLits), Vec_IntSize(vLits), 0 );
        if ( fVerbose )
        {
            printf( "Status %s   Selected %5d assumptions out of %5d.  ", status == l_False ? "OK ":"BUG", nFinal, Vec_IntSize(vLits) );
            Abc_PrintTime( 1, "LEXUNSAT     ", Abc_Clock() - clk );
        }
        if ( CountBest > nFinal )
        {
            CountBest = nFinal;
            ABC_FREE( pCexBest );
            pCexBest = Bmc_CexCareDeriveCex( pCex, iFirstVar, Vec_IntArray(vLits), nFinal );
        }
    }
    if ( fVerbose )
    {
        printf( "Final    :    " );
        Bmc_CexPrint( pCexBest, pCexBest->nPis, 0 );
    }
    // cleanup
    Vec_IntFreeP( &vLits );
    Vec_IntFreeP( &vTemp );
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pFrames );
    return pCexBest;
}